

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O1

void __thiscall SqlGenerator::generateAggregateQueries(SqlGenerator *this)

{
  Aggregate *pAVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  size_t sVar5;
  TDNode *pTVar6;
  long *plVar7;
  undefined8 *puVar8;
  Attribute *pAVar9;
  pointer ppAVar10;
  Function *pFVar11;
  ulong *puVar12;
  undefined1 **ppuVar13;
  size_type *psVar14;
  Query *pQVar15;
  long *plVar16;
  ulong uVar17;
  char cVar18;
  undefined8 uVar19;
  size_t var;
  __node_base _Var20;
  char *__end;
  ulong uVar21;
  pair<std::__detail::_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string sumString;
  string prodString;
  string prodString_1;
  string __str_3;
  string aggregateString;
  string joinString;
  string __str_7;
  string attributeString;
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fVarAggregateMap;
  ofstream ofs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  ulong *local_4b8;
  long local_4b0;
  ulong local_4a8;
  long lStack_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  SqlGenerator *local_458;
  string local_450;
  Query *local_430;
  ulong local_428;
  ulong local_420;
  ulong *local_418;
  long local_410;
  ulong local_408;
  long lStack_400;
  string local_3f8;
  Query *local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0 [6];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  char *local_2b0;
  uint local_2a8;
  char local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  _Hashtable<std::bitset<100UL>,_std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<100UL>_>,_std::hash<std::bitset<100UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_270;
  undefined1 local_238 [8];
  _WordT _Stack_230;
  undefined1 *local_228;
  _WordT _Stack_220;
  undefined1 local_218 [216];
  ios_base local_140 [272];
  
  local_310[0] = local_300;
  local_458 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"","");
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"","");
  uVar21 = 0;
  while (sVar5 = TreeDecomposition::numberOfRelations
                           ((local_458->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ), uVar21 < sVar5) {
    pTVar6 = TreeDecomposition::getRelation
                       ((local_458->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar21);
    std::__cxx11::string::_M_append((char *)local_310,(ulong)(pTVar6->_name)._M_dataplus._M_p);
    sVar5 = TreeDecomposition::numberOfRelations
                      ((local_458->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar21 = uVar21 + 1;
    if (uVar21 < sVar5) {
      std::__cxx11::string::append((char *)local_310);
    }
  }
  local_270._M_buckets = &local_270._M_single_bucket;
  local_270._M_bucket_count = 1;
  local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_270._M_element_count = 0;
  local_270._M_rehash_policy._M_max_load_factor = 1.0;
  local_270._M_rehash_policy._M_next_resize = 0;
  local_270._M_single_bucket = (__node_base_ptr)0x0;
  local_428 = 0;
  uVar21 = 0;
  do {
    sVar5 = QueryCompiler::numberOfQueries
                      ((local_458->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar5 <= local_428) {
      local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)local_3d0);
      std::ofstream::ofstream(local_238,(string *)local_3d0,_S_out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
        operator_delete(local_3d0[0]._M_dataplus._M_p);
      }
      if (local_270._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
        local_428 = 0;
      }
      else {
        local_428 = 0;
        _Var20._M_nxt = local_270._M_before_begin._M_nxt;
        do {
          local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"");
          uVar21 = 0;
          do {
            if (((ulong)_Var20._M_nxt[(uVar21 >> 6) + 1]._M_nxt >> (uVar21 & 0x3f) & 1) != 0) {
              pAVar9 = TreeDecomposition::getAttribute
                                 ((local_458->_td).
                                  super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,uVar21);
              local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
              pcVar2 = (pAVar9->_name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_498,pcVar2,pcVar2 + (pAVar9->_name)._M_string_length);
              std::__cxx11::string::append((char *)&local_498);
              std::__cxx11::string::_M_append((char *)local_3d0,(ulong)local_498._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p);
              }
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != 100);
          std::__cxx11::string::pop_back();
          cVar18 = '\x01';
          if (9 < local_428) {
            uVar21 = local_428;
            cVar3 = '\x04';
            do {
              cVar18 = cVar3;
              if (uVar21 < 100) {
                cVar18 = cVar18 + -2;
                goto LAB_0029b7fb;
              }
              if (uVar21 < 1000) {
                cVar18 = cVar18 + -1;
                goto LAB_0029b7fb;
              }
              if (uVar21 < 10000) goto LAB_0029b7fb;
              bVar4 = 99999 < uVar21;
              uVar21 = uVar21 / 10000;
              cVar3 = cVar18 + '\x04';
            } while (bVar4);
            cVar18 = cVar18 + '\x01';
          }
LAB_0029b7fb:
          local_418 = &local_408;
          std::__cxx11::string::_M_construct((ulong)&local_418,cVar18);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_418,(uint)local_410,local_428);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x2b4b4e);
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          psVar14 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_3f8.field_2._M_allocated_capacity = *psVar14;
            local_3f8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_3f8.field_2._M_allocated_capacity = *psVar14;
            local_3f8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_3f8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_3f8);
          local_4b8 = &local_4a8;
          puVar12 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar12) {
            local_4a8 = *puVar12;
            lStack_4a0 = plVar7[3];
          }
          else {
            local_4a8 = *puVar12;
            local_4b8 = (ulong *)*plVar7;
          }
          local_4b0 = plVar7[1];
          *plVar7 = (long)puVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_4b8,(ulong)local_3d0[0]._M_dataplus._M_p);
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          psVar14 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_450.field_2._M_allocated_capacity = *psVar14;
            local_450.field_2._8_8_ = puVar8[3];
          }
          else {
            local_450.field_2._M_allocated_capacity = *psVar14;
            local_450._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_450._M_string_length = puVar8[1];
          *puVar8 = psVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_450,(ulong)_Var20._M_nxt[3]._M_nxt);
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          puVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_4d8.field_2._M_allocated_capacity = *puVar12;
            local_4d8.field_2._8_8_ = puVar8[3];
          }
          else {
            local_4d8.field_2._M_allocated_capacity = *puVar12;
            local_4d8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_4d8._M_string_length = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_4d8);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          psVar14 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_478.field_2._M_allocated_capacity = *psVar14;
            local_478.field_2._8_8_ = puVar8[3];
          }
          else {
            local_478.field_2._M_allocated_capacity = *psVar14;
            local_478._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_478._M_string_length = puVar8[1];
          *puVar8 = psVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_310[0]);
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          psVar14 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_498.field_2._M_allocated_capacity = *psVar14;
            local_498.field_2._8_8_ = plVar7[3];
          }
          else {
            local_498.field_2._M_allocated_capacity = *psVar14;
            local_498._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_498._M_string_length = plVar7[1];
          *plVar7 = (long)psVar14;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,local_498._M_dataplus._M_p,local_498._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p);
          }
          if (local_4b8 != &local_4a8) {
            operator_delete(local_4b8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
          if (local_418 != &local_408) {
            operator_delete(local_418);
          }
          if (local_3d0[0]._M_string_length != 0) {
            std::__cxx11::string::pop_back();
            std::operator+(&local_498,"\nGROUP BY ",local_3d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,local_498._M_dataplus._M_p,local_498._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,");\n\n",4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
            operator_delete(local_3d0[0]._M_dataplus._M_p);
          }
          local_428 = local_428 + 1;
          _Var20._M_nxt = (_Var20._M_nxt)->_M_nxt;
        } while (_Var20._M_nxt != (_Hash_node_base *)0x0);
      }
      std::ofstream::close();
      local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                 DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
      std::__cxx11::string::append((char *)local_3d0);
      std::ofstream::open((string *)local_238,(_Ios_Openmode)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
        operator_delete(local_3d0[0]._M_dataplus._M_p);
      }
      local_430 = (Query *)0x0;
      do {
        sVar5 = QueryCompiler::numberOfQueries
                          ((local_458->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (sVar5 <= local_430) {
          std::ofstream::close();
          local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                     DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
          std::__cxx11::string::append((char *)local_3d0);
          std::ofstream::open((string *)local_238,(_Ios_Openmode)local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
            operator_delete(local_3d0[0]._M_dataplus._M_p);
          }
          if (local_428 != 0) {
            uVar21 = 0;
            do {
              cVar18 = '\x01';
              if (9 < uVar21) {
                uVar17 = uVar21;
                cVar3 = '\x04';
                do {
                  cVar18 = cVar3;
                  if (uVar17 < 100) {
                    cVar18 = cVar18 + -2;
                    goto LAB_0029c8f8;
                  }
                  if (uVar17 < 1000) {
                    cVar18 = cVar18 + -1;
                    goto LAB_0029c8f8;
                  }
                  if (uVar17 < 10000) goto LAB_0029c8f8;
                  bVar4 = 99999 < uVar17;
                  uVar17 = uVar17 / 10000;
                  cVar3 = cVar18 + '\x04';
                } while (bVar4);
                cVar18 = cVar18 + '\x01';
              }
LAB_0029c8f8:
              local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_478,cVar18);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_478._M_dataplus._M_p,(uint)local_478._M_string_length,uVar21);
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x2b4b9c);
              local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
              psVar14 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_498.field_2._M_allocated_capacity = *psVar14;
                local_498.field_2._8_8_ = puVar8[3];
              }
              else {
                local_498.field_2._M_allocated_capacity = *psVar14;
                local_498._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_498._M_string_length = puVar8[1];
              *puVar8 = psVar14;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
              local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
              psVar14 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_3d0[0].field_2._0_8_ = *psVar14;
                local_3d0[0].field_2._8_8_ = puVar8[3];
              }
              else {
                local_3d0[0].field_2._0_8_ = *psVar14;
                local_3d0[0]._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_3d0[0]._M_string_length = puVar8[1];
              *puVar8 = psVar14;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,local_3d0[0]._M_dataplus._M_p,
                         local_3d0[0]._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
                operator_delete(local_3d0[0]._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
                operator_delete(local_478._M_dataplus._M_p);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != local_428);
          }
          std::ofstream::close();
          local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d0,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
                     DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
          pQVar15 = local_430;
          std::__cxx11::string::append((char *)local_3d0);
          std::ofstream::open((string *)local_238,(_Ios_Openmode)local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
            operator_delete(local_3d0[0]._M_dataplus._M_p);
          }
          if (pQVar15 != (Query *)0x0) {
            uVar21 = 0;
            do {
              cVar18 = '\x01';
              if (9 < uVar21) {
                uVar17 = uVar21;
                cVar3 = '\x04';
                do {
                  cVar18 = cVar3;
                  if (uVar17 < 100) {
                    cVar18 = cVar18 + -2;
                    goto LAB_0029cb50;
                  }
                  if (uVar17 < 1000) {
                    cVar18 = cVar18 + -1;
                    goto LAB_0029cb50;
                  }
                  if (uVar17 < 10000) goto LAB_0029cb50;
                  bVar4 = 99999 < uVar17;
                  uVar17 = uVar17 / 10000;
                  cVar3 = cVar18 + '\x04';
                } while (bVar4);
                cVar18 = cVar18 + '\x01';
              }
LAB_0029cb50:
              local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_478,cVar18);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_478._M_dataplus._M_p,(uint)local_478._M_string_length,uVar21);
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x2b4b9c);
              local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
              psVar14 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_498.field_2._M_allocated_capacity = *psVar14;
                local_498.field_2._8_8_ = puVar8[3];
              }
              else {
                local_498.field_2._M_allocated_capacity = *psVar14;
                local_498._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_498._M_string_length = puVar8[1];
              *puVar8 = psVar14;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
              local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
              psVar14 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_3d0[0].field_2._0_8_ = *psVar14;
                local_3d0[0].field_2._8_8_ = puVar8[3];
              }
              else {
                local_3d0[0].field_2._0_8_ = *psVar14;
                local_3d0[0]._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_3d0[0]._M_string_length = puVar8[1];
              *puVar8 = psVar14;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,local_3d0[0]._M_dataplus._M_p,
                         local_3d0[0]._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
                operator_delete(local_3d0[0]._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
                operator_delete(local_478._M_dataplus._M_p);
              }
              uVar21 = uVar21 + 1;
            } while ((Query *)uVar21 != local_430);
          }
          std::ofstream::close();
          local_238 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_238 + *(long *)(_VTT - 0x18)) = _error_with_option_name;
          std::filebuf::~filebuf((filebuf *)&_Stack_230);
          std::ios_base::~ios_base(local_140);
          std::
          _Hashtable<std::bitset<100UL>,_std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<100UL>_>,_std::hash<std::bitset<100UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_270);
          if (local_290[0] != local_280) {
            operator_delete(local_290[0]);
          }
          if (local_310[0] != local_300) {
            operator_delete(local_310[0]);
          }
          return;
        }
        local_3d8 = QueryCompiler::getQuery
                              ((local_458->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               (size_t)local_430);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
        uVar21 = 0;
        do {
          if (((local_3d8->_fVars).super__Base_bitset<2UL>._M_w[uVar21 >> 6] >> (uVar21 & 0x3f) & 1)
              != 0) {
            pAVar9 = TreeDecomposition::getAttribute
                               ((local_458->_td).
                                super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,uVar21);
            local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
            pcVar2 = (pAVar9->_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d0,pcVar2,pcVar2 + (pAVar9->_name)._M_string_length);
            std::__cxx11::string::append((char *)local_3d0);
            std::__cxx11::string::_M_append((char *)&local_498,(ulong)local_3d0[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
              operator_delete(local_3d0[0]._M_dataplus._M_p);
            }
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != 100);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
        ppAVar10 = (local_3d8->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((local_3d8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppAVar10) {
          uVar21 = 0;
          do {
            pAVar1 = ppAVar10[uVar21];
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            local_420 = uVar21;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
            if ((pAVar1->_agg).
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pAVar1->_agg).
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar21 = 0;
              do {
                memcpy(local_3d0,
                       (pAVar1->_agg).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar21,0xc0);
                local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
                sVar5 = 0;
                do {
                  bVar4 = std::bitset<1500UL>::test((bitset<1500UL> *)local_3d0,sVar5);
                  if ((bVar4) &&
                     (pFVar11 = QueryCompiler::getFunction
                                          ((local_458->_qc).
                                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr,sVar5), pFVar11->_operation != dynamic)) {
                    getFunctionString_abi_cxx11_(&local_3f8,local_458,sVar5);
                    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
                    local_4b8 = &local_4a8;
                    puVar12 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar12) {
                      local_4a8 = *puVar12;
                      lStack_4a0 = puVar8[3];
                    }
                    else {
                      local_4a8 = *puVar12;
                      local_4b8 = (ulong *)*puVar8;
                    }
                    local_4b0 = puVar8[1];
                    *puVar8 = puVar12;
                    puVar8[1] = 0;
                    *(undefined1 *)(puVar8 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_4b8);
                    if (local_4b8 != &local_4a8) {
                      operator_delete(local_4b8);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                      operator_delete(local_3f8._M_dataplus._M_p);
                    }
                  }
                  sVar5 = sVar5 + 1;
                } while (sVar5 != 0x5dc);
                if (local_450._M_string_length == 0) {
                  std::__cxx11::string::append((char *)&local_450);
                }
                else {
                  std::__cxx11::string::pop_back();
                }
                local_4b8 = &local_4a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4b8,local_450._M_dataplus._M_p,
                           local_450._M_dataplus._M_p + local_450._M_string_length);
                std::__cxx11::string::append((char *)&local_4b8);
                std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_4b8);
                if (local_4b8 != &local_4a8) {
                  operator_delete(local_4b8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 < (ulong)(((long)(pAVar1->_agg).
                                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pAVar1->_agg).
                                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 6) *
                                       -0x5555555555555555));
            }
            std::__cxx11::string::pop_back();
            std::operator+(&local_3f8,"SUM(",&local_4d8);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
            local_4b8 = &local_4a8;
            puVar12 = puVar8 + 2;
            if ((ulong *)*puVar8 == puVar12) {
              local_4a8 = *puVar12;
              lStack_4a0 = puVar8[3];
            }
            else {
              local_4a8 = *puVar12;
              local_4b8 = (ulong *)*puVar8;
            }
            local_4b0 = puVar8[1];
            *puVar8 = puVar12;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            cVar18 = '\x01';
            if (9 < local_420) {
              uVar21 = local_420;
              cVar3 = '\x04';
              do {
                cVar18 = cVar3;
                if (uVar21 < 100) {
                  cVar18 = cVar18 + -2;
                  goto LAB_0029c097;
                }
                if (uVar21 < 1000) {
                  cVar18 = cVar18 + -1;
                  goto LAB_0029c097;
                }
                if (uVar21 < 10000) goto LAB_0029c097;
                bVar4 = 99999 < uVar21;
                uVar21 = uVar21 / 10000;
                cVar3 = cVar18 + '\x04';
              } while (bVar4);
              cVar18 = cVar18 + '\x01';
            }
LAB_0029c097:
            local_418 = &local_408;
            std::__cxx11::string::_M_construct((ulong)&local_418,cVar18);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_418,(uint)local_410,local_420);
            uVar21 = 0xf;
            if (local_4b8 != &local_4a8) {
              uVar21 = local_4a8;
            }
            if (uVar21 < (ulong)(local_410 + local_4b0)) {
              uVar21 = 0xf;
              if (local_418 != &local_408) {
                uVar21 = local_408;
              }
              if (uVar21 < (ulong)(local_410 + local_4b0)) goto LAB_0029c117;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_418,0,(char *)0x0,(ulong)local_4b8);
            }
            else {
LAB_0029c117:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_418);
            }
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            psVar14 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_450.field_2._M_allocated_capacity = *psVar14;
              local_450.field_2._8_8_ = puVar8[3];
            }
            else {
              local_450.field_2._M_allocated_capacity = *psVar14;
              local_450._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_450._M_string_length = puVar8[1];
            *puVar8 = psVar14;
            puVar8[1] = 0;
            *(undefined1 *)psVar14 = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_450);
            local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
            psVar14 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_3d0[0].field_2._0_8_ = *psVar14;
              local_3d0[0].field_2._8_8_ = plVar7[3];
            }
            else {
              local_3d0[0].field_2._0_8_ = *psVar14;
              local_3d0[0]._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_3d0[0]._M_string_length = plVar7[1];
            *plVar7 = (long)psVar14;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_3d0[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
              operator_delete(local_3d0[0]._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
              operator_delete(local_450._M_dataplus._M_p);
            }
            if (local_418 != &local_408) {
              operator_delete(local_418);
            }
            if (local_4b8 != &local_4a8) {
              operator_delete(local_4b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p);
            }
            uVar21 = local_420 + 1;
            ppAVar10 = (local_3d8->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (uVar21 < (ulong)((long)(local_3d8->_aggregates).
                                          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppAVar10 >> 3));
        }
        std::__cxx11::string::pop_back();
        local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"");
        if (local_498._M_string_length != 0) {
          std::operator+(&local_4d8,&local_498,&local_478);
          std::__cxx11::string::operator=((string *)&local_478,(string *)&local_4d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p);
          }
          std::__cxx11::string::pop_back();
          std::operator+(&local_4d8,"\nGROUP BY ",&local_498);
          std::__cxx11::string::_M_append((char *)local_3d0,(ulong)local_4d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p);
          }
        }
        cVar18 = '\x01';
        if (9 < local_430) {
          pQVar15 = local_430;
          cVar3 = '\x04';
          do {
            cVar18 = cVar3;
            if (pQVar15 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_0029c3c9;
            }
            if (pQVar15 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_0029c3c9;
            }
            if (pQVar15 < 10000) goto LAB_0029c3c9;
            bVar4 = 99999 < pQVar15;
            pQVar15 = (Query *)((ulong)pQVar15 / 10000);
            cVar3 = cVar18 + '\x04';
          } while (bVar4);
          cVar18 = cVar18 + '\x01';
        }
LAB_0029c3c9:
        local_2b0 = local_2a0;
        std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_2b0,local_2a8,(unsigned_long)local_430);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x2b4b4e);
        local_2f0 = &local_2e0;
        plVar16 = plVar7 + 2;
        if ((long *)*plVar7 == plVar16) {
          local_2e0 = *plVar16;
          lStack_2d8 = plVar7[3];
        }
        else {
          local_2e0 = *plVar16;
          local_2f0 = (long *)*plVar7;
        }
        local_2e8 = plVar7[1];
        *plVar7 = (long)plVar16;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_2d0 = &local_2c0;
        plVar16 = plVar7 + 2;
        if ((long *)*plVar7 == plVar16) {
          local_2c0 = *plVar16;
          lStack_2b8 = plVar7[3];
        }
        else {
          local_2c0 = *plVar16;
          local_2d0 = (long *)*plVar7;
        }
        local_2c8 = plVar7[1];
        *plVar7 = (long)plVar16;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2d0,(ulong)local_478._M_dataplus._M_p);
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_408 = *puVar12;
          lStack_400 = plVar7[3];
          local_418 = &local_408;
        }
        else {
          local_408 = *puVar12;
          local_418 = (ulong *)*plVar7;
        }
        local_410 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_418);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        psVar14 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_3f8.field_2._M_allocated_capacity = *psVar14;
          local_3f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_3f8.field_2._M_allocated_capacity = *psVar14;
          local_3f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_3f8._M_string_length = puVar8[1];
        *puVar8 = psVar14;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_310[0]);
        local_4b8 = &local_4a8;
        puVar12 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar12) {
          local_4a8 = *puVar12;
          lStack_4a0 = puVar8[3];
        }
        else {
          local_4a8 = *puVar12;
          local_4b8 = (ulong *)*puVar8;
        }
        local_4b0 = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_4b8,(ulong)local_3d0[0]._M_dataplus._M_p);
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        psVar14 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_450.field_2._M_allocated_capacity = *psVar14;
          local_450.field_2._8_8_ = puVar8[3];
        }
        else {
          local_450.field_2._M_allocated_capacity = *psVar14;
          local_450._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_450._M_string_length = puVar8[1];
        *puVar8 = psVar14;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        puVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_4d8.field_2._M_allocated_capacity = *puVar12;
          local_4d8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_4d8.field_2._M_allocated_capacity = *puVar12;
          local_4d8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_4d8._M_string_length = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p);
        }
        if (local_4b8 != &local_4a8) {
          operator_delete(local_4b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        if (local_418 != &local_408) {
          operator_delete(local_418);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0);
        }
        if (local_2b0 != local_2a0) {
          operator_delete(local_2b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
          operator_delete(local_3d0[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        local_430 = (Query *)((long)local_430 + 1);
      } while( true );
    }
    local_430 = QueryCompiler::getQuery
                          ((local_458->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           local_428);
    local_3d0[0]._M_dataplus._M_p = (pointer)&local_3d0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"");
    ppAVar10 = (local_430->_aggregates).
               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((local_430->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppAVar10) {
      pQVar15 = (Query *)0x0;
      do {
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        pAVar1 = ppAVar10[(long)pQVar15];
        local_3d8 = pQVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
        local_420 = uVar21;
        if ((pAVar1->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pAVar1->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar21 = 0;
          do {
            memcpy((bitset<1500UL> *)local_238,
                   (pAVar1->_agg).
                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar21,0xc0);
            local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
            sVar5 = 0;
            do {
              bVar4 = std::bitset<1500UL>::test((bitset<1500UL> *)local_238,sVar5);
              if (bVar4) {
                getFunctionString_abi_cxx11_(&local_450,local_458,sVar5);
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_450);
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                puVar12 = (ulong *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar12) {
                  local_4d8.field_2._M_allocated_capacity = *puVar12;
                  local_4d8.field_2._8_8_ = plVar7[3];
                }
                else {
                  local_4d8.field_2._M_allocated_capacity = *puVar12;
                  local_4d8._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_4d8._M_string_length = plVar7[1];
                *plVar7 = (long)puVar12;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_478,(ulong)local_4d8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p);
                }
              }
              sVar5 = sVar5 + 1;
            } while (sVar5 != 0x5dc);
            if (local_478._M_string_length == 0) {
              std::__cxx11::string::append((char *)&local_478);
            }
            else {
              std::__cxx11::string::pop_back();
            }
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4d8,local_478._M_dataplus._M_p,
                       local_478._M_dataplus._M_p + local_478._M_string_length);
            std::__cxx11::string::append((char *)&local_4d8);
            std::__cxx11::string::_M_append((char *)&local_498,(ulong)local_4d8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)(((long)(pAVar1->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pAVar1->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 6) *
                                   -0x5555555555555555));
        }
        std::__cxx11::string::pop_back();
        std::operator+(&local_450,"SUM(",&local_498);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
        uVar21 = local_420;
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        puVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_4d8.field_2._M_allocated_capacity = *puVar12;
          local_4d8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_4d8.field_2._M_allocated_capacity = *puVar12;
          local_4d8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_4d8._M_string_length = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        cVar18 = '\x01';
        if (9 < local_420) {
          uVar17 = local_420;
          cVar3 = '\x04';
          do {
            cVar18 = cVar3;
            if (uVar17 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_0029b391;
            }
            if (uVar17 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_0029b391;
            }
            if (uVar17 < 10000) goto LAB_0029b391;
            bVar4 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar3 = cVar18 + '\x04';
          } while (bVar4);
          cVar18 = cVar18 + '\x01';
        }
LAB_0029b391:
        local_4b8 = &local_4a8;
        std::__cxx11::string::_M_construct((ulong)&local_4b8,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_4b8,(uint)local_4b0,uVar21);
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          uVar19 = local_4d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_4b0 + local_4d8._M_string_length) {
          uVar17 = 0xf;
          if (local_4b8 != &local_4a8) {
            uVar17 = local_4a8;
          }
          if (uVar17 < local_4b0 + local_4d8._M_string_length) goto LAB_0029b400;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_4b8,0,(char *)0x0,(ulong)local_4d8._M_dataplus._M_p);
        }
        else {
LAB_0029b400:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_4b8);
        }
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        psVar14 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_478.field_2._M_allocated_capacity = *psVar14;
          local_478.field_2._8_8_ = puVar8[3];
        }
        else {
          local_478.field_2._M_allocated_capacity = *psVar14;
          local_478._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_478._M_string_length = puVar8[1];
        *puVar8 = psVar14;
        puVar8[1] = 0;
        *(undefined1 *)psVar14 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_478);
        ppuVar13 = (undefined1 **)(plVar7 + 2);
        if ((undefined1 **)*plVar7 == ppuVar13) {
          local_228 = *ppuVar13;
          _Stack_220 = plVar7[3];
          local_238 = (undefined1  [8])&local_228;
        }
        else {
          local_228 = *ppuVar13;
          local_238 = (undefined1  [8])*plVar7;
        }
        _Stack_230 = plVar7[1];
        *plVar7 = (long)ppuVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_3d0,(ulong)local_238);
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        if (local_4b8 != &local_4a8) {
          operator_delete(local_4b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        uVar21 = uVar21 + 1;
        pQVar15 = (Query *)((long)&local_3d8->_rootID + 1);
        ppAVar10 = (local_430->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (pQVar15 < (Query *)((long)(local_430->_aggregates).
                                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar10
                                  >> 3));
    }
    local_238 = (undefined1  [8])(local_430->_fVars).super__Base_bitset<2UL>._M_w[0];
    _Stack_230 = (local_430->_fVars).super__Base_bitset<2UL>._M_w[1];
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
    pVar22 = std::
             _Hashtable<std::bitset<100ul>,std::pair<std::bitset<100ul>const,std::__cxx11::string>,std::allocator<std::pair<std::bitset<100ul>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::bitset<100ul>>,std::hash<std::bitset<100ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<std::pair<std::bitset<100ul>const,std::__cxx11::string>>
                       ((_Hashtable<std::bitset<100ul>,std::pair<std::bitset<100ul>const,std::__cxx11::string>,std::allocator<std::pair<std::bitset<100ul>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::bitset<100ul>>,std::hash<std::bitset<100ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&local_270,(bitset<1500UL> *)local_238);
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
    std::__cxx11::string::_M_append
              ((char *)((long)pVar22.first.
                              super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       + 0x18),(ulong)local_3d0[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != &local_3d0[0].field_2) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_428 = local_428 + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateAggregateQueries()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }
    
    // for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    //     attributeString += _td->getAttribute(var)->_name + ",";
    // attributeString.pop_back();
    
    //********** TODO: TODO: ********** 
    // technically we need to join in the parameters
    // for now we just fix the params
    //********** TODO: TODO: **********
    // TODO: TODO: TODO: THIS SHOULD REALLY BE LINEARREGRESSION GRADIENT
    // TODO: TODO: TODO: Commenting out for now
    // if (false && _model == LinearRegressionModel)
    // {
    //     // Add parameters to the join string !
    //     var_bitset features = _app->getFeatures();

    //     const var_bitset categoricalFeatures =
    //         static_pointer_cast<LinearRegression>(_app)->
    //         getCategoricalFeatures();
        
    //     std::string catParams = "", contParams = "";
    //     for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    //     {
    //         if (features[var])
    //         {
    //             Attribute* attr = _td->getAttribute(var);

    //             if (categoricalFeatures[var])
    //                 catParams += " NATURAL JOIN "+attr->_name+"_param";
    //             else
    //                 contParams += ","+attr->_name+"_param";
    //         }
    //     }
        
    //     joinString += catParams + contParams;
    // }

    unordered_map<var_bitset,string> fVarAggregateMap;

    size_t aggNum = 0;
    
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);
        
        std::string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f))
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();
            aggregateString += "SUM("+sumString+") AS agg_"+to_string(aggNum++)+",";
        }

        auto it_pair = fVarAggregateMap.insert({query->_fVars,""});
        it_pair.first->second += aggregateString;        
    }

    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates_merged.sql", std::ofstream::out);

    size_t aggID = 0;
    for (auto& fvarAggPair : fVarAggregateMap)
    {
        string fVarString = "";
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (fvarAggPair.first[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        fvarAggPair.second.pop_back();
        
        ofs << "CREATE TABLE agg_"+to_string(aggID++)+" AS (\n" 
            "SELECT "+fVarString+fvarAggPair.second+"\nFROM "+joinString;
        if (!fVarString.empty())
        {
            fVarString.pop_back();
            ofs << "\nGROUP BY "+fVarString;
        }
        ofs << ");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates.sql", std::ofstream::out);

    size_t aggID_unmerged = 0;
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);

        string fVarString = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (query->_fVars[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f) &&
                        _qc->getFunction(f)->_operation != Operation::dynamic)
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();

            aggregateString +="SUM("+sumString+") AS agg_"+to_string(agg)+",";
        }
        aggregateString.pop_back();
        
        std::string groupByString = "";
        if (!fVarString.empty())
        {
            aggregateString = fVarString+aggregateString;
            fVarString.pop_back();
            groupByString += "\nGROUP BY "+fVarString;
        }
        
        ofs << "CREATE TABLE agg_"+to_string(aggID_unmerged++)+" AS (\nSELECT "+
            aggregateString+"\nFROM "+joinString+groupByString+");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_merged_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID_unmerged; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();


}